

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O1

bool __thiscall
glcts::StateInteractionCase::checkSurface
          (StateInteractionCase *this,Surface *surface,RGBA expectedColor)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  if (0 < surface->m_height) {
    uVar1 = surface->m_width;
    iVar3 = 0;
    iVar5 = 0;
    iVar4 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar6 = (ulong)uVar1;
        iVar2 = iVar3;
        do {
          iVar4 = iVar4 + (uint)(*(deUint32 *)((long)(surface->m_pixels).m_ptr + (long)iVar2 * 4) !=
                                expectedColor.m_value);
          iVar2 = iVar2 + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      iVar5 = iVar5 + 1;
      iVar3 = iVar3 + uVar1;
    } while (iVar5 != surface->m_height);
    return iVar4 == 0;
  }
  return true;
}

Assistant:

bool checkSurface(tcu::Surface surface, tcu::RGBA expectedColor)
	{
		int numFailedPixels = 0;
		for (int y = 0; y < surface.getHeight(); y++)
		{
			for (int x = 0; x < surface.getWidth(); x++)
			{
				if (surface.getPixel(x, y) != expectedColor)
					numFailedPixels += 1;
			}
		}

		return (numFailedPixels == 0);
	}